

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O3

uLong cm_zlib_adler32_z(uLong adler,Bytef *buf,z_size_t len)

{
  undefined1 auVar1 [16];
  z_size_t zVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  
  uVar16 = adler & 0xffff;
  uVar5 = adler >> 0x10 & 0xffff;
  if (len == 1) {
    uVar4 = uVar16 + *buf;
    uVar16 = (uVar16 - 0xfff1) + (ulong)*buf;
    if (uVar4 < 0xfff1) {
      uVar16 = uVar4;
    }
    uVar7 = (uVar5 + uVar16) * 0x10000;
    uVar4 = uVar7 - 0xfff10000;
    if (uVar5 + uVar16 < 0xfff1) {
      uVar4 = uVar7;
    }
    return uVar4 | uVar16;
  }
  if (buf == (Bytef *)0x0) {
    return 1;
  }
  if (len < 0x10) {
    if (len != 0) {
      zVar2 = 0;
      do {
        uVar16 = uVar16 + buf[zVar2];
        uVar5 = uVar5 + uVar16;
        zVar2 = zVar2 + 1;
      } while (len != zVar2);
    }
    uVar4 = uVar16 - 0xfff1;
    if (uVar16 < 0xfff1) {
      uVar4 = uVar16;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    iVar6 = SUB164(auVar1 * ZEXT816(0xf00e10d2fc5cd),8);
    return ((int)uVar5 + (((uint)((int)uVar5 - iVar6) >> 1) + iVar6 >> 0xf) * -0xfff1) * 0x10000 |
           uVar4;
  }
  if (len < 0x15b0) {
LAB_00775969:
    do {
      len = len - 0x10;
      lVar3 = *buf + uVar16;
      lVar15 = (ulong)buf[1] + lVar3;
      lVar8 = (ulong)buf[2] + lVar15;
      lVar17 = (ulong)buf[3] + lVar8;
      lVar9 = (ulong)buf[4] + lVar17;
      lVar18 = (ulong)buf[5] + lVar9;
      lVar10 = (ulong)buf[6] + lVar18;
      lVar19 = (ulong)buf[7] + lVar10;
      lVar11 = (ulong)buf[8] + lVar19;
      lVar20 = (ulong)buf[9] + lVar11;
      lVar12 = (ulong)buf[10] + lVar20;
      lVar21 = (ulong)buf[0xb] + lVar12;
      lVar13 = (ulong)buf[0xc] + lVar21;
      lVar22 = (ulong)buf[0xd] + lVar13;
      lVar14 = (ulong)buf[0xe] + lVar22;
      uVar16 = (ulong)buf[0xf] + lVar14;
      uVar5 = uVar5 + lVar3 + lVar15 + lVar8 + lVar17 + lVar9 + lVar18 + lVar10 + lVar19 + lVar11 +
              lVar20 + lVar12 + lVar21 + lVar13 + lVar22 + lVar14 + uVar16;
      buf = buf + 0x10;
    } while (0xf < len);
    if (len != 0) goto LAB_00775a1f;
  }
  else {
    do {
      len = len - 0x15b0;
      lVar3 = 0;
      do {
        lVar8 = buf[lVar3] + uVar16;
        lVar17 = (ulong)buf[lVar3 + 1] + lVar8;
        lVar9 = (ulong)buf[lVar3 + 2] + lVar17;
        lVar18 = (ulong)buf[lVar3 + 3] + lVar9;
        lVar10 = (ulong)buf[lVar3 + 4] + lVar18;
        lVar19 = (ulong)buf[lVar3 + 5] + lVar10;
        lVar11 = (ulong)buf[lVar3 + 6] + lVar19;
        lVar20 = (ulong)buf[lVar3 + 7] + lVar11;
        lVar12 = (ulong)buf[lVar3 + 8] + lVar20;
        lVar21 = (ulong)buf[lVar3 + 9] + lVar12;
        lVar13 = (ulong)buf[lVar3 + 10] + lVar21;
        lVar22 = (ulong)buf[lVar3 + 0xb] + lVar13;
        lVar14 = (ulong)buf[lVar3 + 0xc] + lVar22;
        lVar23 = (ulong)buf[lVar3 + 0xd] + lVar14;
        lVar15 = (ulong)buf[lVar3 + 0xe] + lVar23;
        uVar16 = (ulong)buf[lVar3 + 0xf] + lVar15;
        uVar5 = uVar5 + lVar8 + lVar17 + lVar9 + lVar18 + lVar10 + lVar19 + lVar11 + lVar20 + lVar12
                + lVar21 + lVar13 + lVar22 + lVar14 + lVar23 + lVar15 + uVar16;
        lVar3 = lVar3 + 0x10;
      } while ((int)lVar3 != 0x15b0);
      buf = buf + 0x15b0;
      uVar16 = uVar16 % 0xfff1;
      uVar5 = uVar5 % 0xfff1;
    } while (0x15af < len);
    if (len == 0) goto LAB_00775a7d;
    if (0xf < len) goto LAB_00775969;
LAB_00775a1f:
    uVar4 = 0;
    do {
      uVar16 = uVar16 + buf[uVar4];
      uVar5 = uVar5 + uVar16;
      uVar4 = uVar4 + 1;
    } while (len != uVar4);
  }
  uVar16 = uVar16 % 0xfff1;
  uVar5 = uVar5 % 0xfff1;
LAB_00775a7d:
  return uVar5 << 0x10 | uVar16;
}

Assistant:

uLong ZEXPORT adler32_z(adler, buf, len)
    uLong adler;
    const Bytef *buf;
    z_size_t len;
{
    unsigned long sum2;
    unsigned n;

    /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (len == 1) {
        adler += buf[0];
        if (adler >= BASE)
            adler -= BASE;
        sum2 += adler;
        if (sum2 >= BASE)
            sum2 -= BASE;
        return adler | (sum2 << 16);
    }

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (buf == Z_NULL)
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (len < 16) {
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        if (adler >= BASE)
            adler -= BASE;
        MOD28(sum2);            /* only added so many BASE's */
        return adler | (sum2 << 16);
    }

    /* do length NMAX blocks -- requires just one modulo operation */
    while (len >= NMAX) {
        len -= NMAX;
        n = NMAX / 16;          /* NMAX is divisible by 16 */
        do {
            DO16(buf);          /* 16 sums unrolled */
            buf += 16;
        } while (--n);
        MOD(adler);
        MOD(sum2);
    }

    /* do remaining bytes (less than NMAX, still just one modulo) */
    if (len) {                  /* avoid modulos if none remaining */
        while (len >= 16) {
            len -= 16;
            DO16(buf);
            buf += 16;
        }
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        MOD(adler);
        MOD(sum2);
    }

    /* return recombined sums */
    return adler | (sum2 << 16);
}